

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Program * __thiscall Compiler::dump(Program *__return_storage_ptr__,Compiler *this)

{
  undefined4 uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  Value *pVVar6;
  int local_18;
  int local_14;
  int f;
  int c;
  Compiler *this_local;
  
  sVar3 = std::vector<Value,_std::allocator<Value>_>::size(&conv);
  curProg.conSize = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&instv);
  curProg.inSize = (int)sVar3;
  curProg.instr = (int *)malloc((long)curProg.inSize << 2);
  local_14 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&instv);
    if (sVar3 <= (ulong)(long)local_14) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(&instv,(long)local_14);
    curProg.instr[local_14] = *pvVar4;
    local_14 = local_14 + 1;
  }
  curProg.Consts = (Value *)malloc((long)curProg.conSize << 4);
  local_18 = 0;
  while( true ) {
    sVar3 = std::vector<Value,_std::allocator<Value>_>::size(&conv);
    iVar2 = curProg.inSize;
    if (sVar3 <= (ulong)(long)local_18) break;
    pvVar5 = std::vector<Value,_std::allocator<Value>_>::at(&conv,(long)local_18);
    pVVar6 = curProg.Consts + local_18;
    uVar1 = *(undefined4 *)&pvVar5->field_0x4;
    pVVar6->v = pvVar5->v;
    *(undefined4 *)&pVVar6->field_0x4 = uVar1;
    pVVar6->field_1 = *(anon_union_8_3_805d2717_for_Value_1 *)&pvVar5->field_1;
    local_18 = local_18 + 1;
  }
  __return_storage_ptr__->conSize = curProg.conSize;
  __return_storage_ptr__->inSize = iVar2;
  __return_storage_ptr__->instr = curProg.instr;
  __return_storage_ptr__->Consts = curProg.Consts;
  return __return_storage_ptr__;
}

Assistant:

Program Compiler::dump() {
  curProg.conSize = conv.size();
  curProg.inSize = instv.size();
  curProg.instr = (int *)malloc(sizeof(int) * curProg.inSize);
  for(int c = 0; c < instv.size(); c++) {
    curProg.instr[c] = instv.at(c);
  }
  curProg.Consts = (Value *)malloc(sizeof(Value) * curProg.conSize);
  for(int f = 0; f < conv.size(); f++) {
    curProg.Consts[f] = conv.at(f);
  }

  return curProg;
}